

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# platform_thread_types.cc
# Opt level: O1

PlatformThreadId dd::CurrentThreadId(void)

{
  long lVar1;
  
  lVar1 = syscall(0xba);
  return (PlatformThreadId)lVar1;
}

Assistant:

PlatformThreadId CurrentThreadId()
	{
#ifdef _WIN32
		return GetCurrentThreadId();
#else
		//return reinterpret_cast<PlatformThreadId>(pthread_self());
		 return syscall(__NR_gettid);
#endif
	}